

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::QGraphicsAnchorLayoutPrivate(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsLayoutItemPrivate::QGraphicsLayoutItemPrivate
            ((QGraphicsLayoutItemPrivate *)this,(QGraphicsLayoutItem *)0x0,true);
  (this->super_QGraphicsLayoutPrivate).left = -1.0;
  (this->super_QGraphicsLayoutPrivate).top = -1.0;
  (this->super_QGraphicsLayoutPrivate).right = -1.0;
  (this->super_QGraphicsLayoutPrivate).bottom = -1.0;
  (this->super_QGraphicsLayoutPrivate).activated = true;
  (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
  _vptr_QGraphicsLayoutItemPrivate = (_func_int **)&PTR__QGraphicsAnchorLayoutPrivate_00811268;
  (this->spacings).m_data[0] = -1.0;
  (this->spacings).m_data[1] = -1.0;
  (this->sizeHints).m_data[0]._M_elems[2] = -1.0;
  (this->sizeHints).m_data[0]._M_elems[0] = -1.0;
  (this->sizeHints).m_data[0]._M_elems[1] = -1.0;
  (this->sizeHints).m_data[1]._M_elems[2] = -1.0;
  (this->sizeHints).m_data[1]._M_elems[0] = -1.0;
  (this->sizeHints).m_data[1]._M_elems[1] = -1.0;
  memset(&this->items,0,0x140);
  (this->interpolationProgress).m_data[0] = -1.0;
  (this->interpolationProgress).m_data[1] = -1.0;
  *(undefined2 *)(this->graphHasConflicts).m_data = 0;
  (this->m_floatItems).m_data[0].q_hash.d = (Data *)0x0;
  (this->m_floatItems).m_data[1].q_hash.d = (Data *)0x0;
  this->field_0x2c0 = this->field_0x2c0 | 3;
  QStyleOption::QStyleOption(&(this->cachedStyleInfo).m_styleOption,1,0);
  (this->cachedStyleInfo).m_valid = false;
  (this->cachedStyleInfo).m_style = (QStyle *)0x0;
  (this->cachedStyleInfo).m_widget = (QWidget *)0x0;
  return;
}

Assistant:

QGraphicsAnchorLayoutPrivate::QGraphicsAnchorLayoutPrivate()
    : calculateGraphCacheDirty(true), styleInfoDirty(true)
{
}